

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Parser * parser::Parser::New(Lexer *l)

{
  Parser *this;
  
  this = (Parser *)operator_new(0x120);
  Parser(this,l);
  nextToken(this);
  nextToken(this);
  return this;
}

Assistant:

Parser* Parser::New(Lexer *l)
{
    Parser* p = new Parser(l);
    p->nextToken();
    p->nextToken();
    return p;
}